

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O3

void dec_derive_skip_mv_affine(com_core_t *core,int mrg_idx)

{
  pthread_mutex_t *ppVar1;
  com_scu_t cVar2;
  char cVar3;
  s16 (*paasVar4) [2] [2];
  com_pic_t *pcVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  com_core_t *pcVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  byte bVar17;
  byte bVar18;
  short sVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  undefined4 *puVar25;
  s16 (*pasVar26) [2];
  short sVar27;
  int iVar28;
  short sVar29;
  uint uVar30;
  int iVar31;
  s16 asVar32 [2];
  undefined4 in_register_00000034;
  int *piVar33;
  com_core_t *pcVar34;
  int iVar35;
  ulong uVar36;
  int *piVar37;
  ushort uVar38;
  s16 asVar39 [2];
  short sVar40;
  ushort uVar41;
  uint uVar42;
  int iVar43;
  int *piVar44;
  uint uVar45;
  uint uVar46;
  int *piVar47;
  s16 asVar48 [2];
  int iVar49;
  ulong unaff_R12;
  int iVar50;
  int iVar51;
  bool bVar52;
  int top_left [5];
  int valid [5];
  int neb_addr_lt [3];
  int neighbor [5];
  CPMV mrg_list_cp_mv [2] [4] [2];
  char local_20e [2];
  int local_20c;
  com_core_t *local_208;
  undefined1 local_1fd;
  int local_1fc;
  undefined1 local_1f8 [6];
  short sStack_1f2;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  int *local_1e0;
  int local_1d8;
  undefined4 uStack_1d4;
  int local_1cc;
  undefined8 local_1c8;
  ulong local_1c0;
  uint local_1b8 [7];
  s16 asStack_19c [6];
  int *local_190;
  ulong local_188;
  int local_17c;
  s16 local_178 [6] [2];
  s16 local_160 [2];
  s16 local_15c [2];
  s8 (*local_158) [2];
  com_scu_t *local_150;
  uint local_148 [7];
  int local_12c;
  int local_128;
  uint local_124;
  int local_120;
  int local_11c;
  int local_118;
  uint local_114;
  int local_110;
  int local_10c;
  long local_108;
  long local_100;
  u32 *local_f8;
  ulong local_f0;
  ulong local_e8;
  com_seqh_t *local_e0;
  ulong local_d8;
  long local_d0;
  ulong local_c8;
  s8 (*local_c0) [2];
  int local_b8 [8];
  int local_98 [8];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_1c8 = CONCAT44(in_register_00000034,mrg_idx);
  uVar46 = core->cu_scup;
  local_e0 = core->seqhdr;
  iVar11 = local_e0->log2_max_cuwh;
  iVar49 = local_e0->i_scu;
  iVar13 = core->cu_width;
  iVar51 = core->cu_height;
  local_100 = (long)iVar13;
  uVar21 = iVar13 >> 2;
  local_108 = (long)iVar51;
  local_158 = (core->map).map_refi;
  paasVar4 = (core->map).map_mv;
  local_150 = (core->map).map_scu;
  local_f8 = (core->map).map_pos;
  local_17c = ((iVar51 >> 2) + -1) * iVar49 + uVar46 + -1;
  local_b8[0] = local_17c;
  uVar30 = uVar46 - iVar49;
  local_120 = uVar21 + uVar30 + -1;
  local_b8[1] = local_120;
  local_e8 = (ulong)uVar21;
  local_11c = uVar21 + uVar30;
  local_b8[2] = local_11c;
  local_d8 = (ulong)uVar46;
  local_124 = uVar46 - 1;
  local_b8[3] = local_124;
  local_f0 = (ulong)uVar30;
  local_128 = uVar30 - 1;
  local_b8[4] = local_128;
  lVar14 = 0;
  do {
    cVar2 = local_150[local_b8[lVar14]];
    local_178[lVar14] = (s16  [2])((byte)cVar2 >> 5 & 3);
    asVar48 = local_178[3];
    if (((byte)cVar2 >> 5 & 3) != 0) {
      local_1b8[lVar14] = local_f8[local_b8[lVar14]] >> 6;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  local_12c = mrg_idx + 1;
  local_118 = 2;
  if (local_12c < 2) {
    local_118 = local_12c;
  }
  if ((local_178[1] != (s16  [2])0x0 && local_178[2] != (s16  [2])0x0) &&
     (local_1b8[1] == local_1b8[2])) {
    local_178[2][0] = 0;
    local_178[2][1] = 0;
  }
  if (((local_178[3] != (s16  [2])0x0) && (local_178[0] != (s16  [2])0x0)) &&
     (local_1b8[0] == local_1b8[3])) {
    local_178[3][0] = 0;
    local_178[3][1] = 0;
  }
  uVar36 = (ulong)core & 0xffffffffffffff00;
  if (((local_178[4] != (s16  [2])0x0 && asVar48 != (s16  [2])0x0) && (local_1b8[4] == local_1b8[3])
      ) || ((local_178[1] != (s16  [2])0x0 && local_178[4] != (s16  [2])0x0 &&
            (local_1b8[4] == local_1b8[1])))) {
    local_178[4][0] = 0;
    local_178[4][1] = 0;
  }
  if (mrg_idx < 0) {
    iVar11 = 0;
  }
  else {
    local_114 = ~(-1 << ((byte)iVar11 & 0x1f));
    uVar24 = 0;
    iVar11 = 0;
    local_110 = iVar49;
    do {
      iVar31 = iVar11;
      if (local_178[uVar24] != (s16  [2])0x0) {
        if (iVar11 == mrg_idx) {
          local_d0 = (long)local_b8[uVar24];
          unaff_R12 = (ulong)(((byte)local_150[local_d0] & 0x60) == 0x20 ^ 3);
          uVar36 = CONCAT71((int7)(uVar36 >> 8),1);
          local_c0 = local_158 + local_d0;
          piVar47 = (int *)local_78;
          pcVar15 = local_20e + 1;
          lVar14 = 0;
          local_c8 = uVar24;
          do {
            cVar3 = local_158[local_d0][lVar14];
            *pcVar15 = cVar3;
            if (-1 < cVar3) {
              local_190 = (int *)CONCAT44(local_190._4_4_,(int)uVar36);
              local_148[0] = local_f8[local_d0];
              bVar17 = (byte)local_148[0] & 7;
              bVar18 = (byte)(local_148[0] >> 3) & 7;
              uVar42 = 1 << bVar18;
              local_148[0] = local_148[0] >> 6;
              uVar22 = (uint)(1 << bVar17) >> 2;
              local_148[1] = (uVar22 + local_148[0]) - 1;
              local_148[2] = ((uVar42 >> 2) - 1) * iVar49 + local_148[0];
              local_148[3] = local_148[2] + uVar22 + -1;
              iVar31 = (int)((long)(ulong)local_148[0] / (long)iVar49);
              iVar28 = (int)((long)(ulong)local_148[0] % (long)iVar49);
              local_1c0 = CONCAT44(local_1c0._4_4_,iVar28);
              lVar16 = 0;
              do {
                *(s16 (*) [2])(local_1f8 + lVar16 * 4) = paasVar4[(int)local_148[lVar16]][lVar14];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
              uVar22 = ((int)uVar46 / iVar49) * 4;
              uVar42 = uVar42 + iVar31 * 4;
              bVar52 = (uVar42 & local_114) == 0;
              bVar10 = uVar42 != uVar22;
              bVar7 = !bVar52;
              if (uVar42 == uVar22 && bVar52) {
                sVar29 = local_1f8._14_2_;
                uVar42 = uVar22;
                sVar27 = uStack_1f0._2_2_;
                sVar40 = (short)uStack_1ec;
                sVar19 = (short)uStack_1f0;
              }
              else {
                uVar42 = iVar31 << 2;
                sVar29 = sStack_1f2;
                sVar27 = local_1f8._2_2_;
                sVar40 = local_1f8._4_2_;
                sVar19 = local_1f8._0_2_;
              }
              bVar17 = bVar17 ^ 7;
              iVar43 = (int)sVar19;
              uVar45 = sVar40 - iVar43 << bVar17;
              iVar31 = (int)sVar27;
              iVar50 = sVar29 - iVar31 << bVar17;
              bVar52 = (int)unaff_R12 == 3;
              local_1fd = bVar52 && (bVar10 || bVar7);
              local_1e0 = piVar47;
              if (bVar52 && (bVar10 || bVar7)) {
                bVar18 = bVar18 ^ 7;
                iVar35 = (short)uStack_1f0 - iVar43 << bVar18;
                local_188 = 3;
                uVar8 = uStack_1f0._2_2_ - iVar31 << bVar18;
              }
              else {
                iVar35 = -iVar50;
                local_188 = 2;
                uVar8 = uVar45;
              }
              iVar23 = ((int)uVar46 % iVar49 - iVar28) * 4;
              iVar20 = uVar22 - uVar42;
              iVar12 = uVar45 * iVar23 + iVar43 * 0x80;
              iVar28 = 0;
              iVar49 = 0;
              uVar42 = iVar35 * iVar20 + iVar12;
              if (uVar42 != 0) {
                uVar22 = (int)uVar42 >> 0x1f;
                iVar49 = (((int)(((uVar42 ^ uVar22) - uVar22) + 0x40) >> 7 ^ uVar22) - uVar22) * 4;
                uStack_1d4 = 0;
              }
              local_1c0 = (ulong)uVar8;
              _local_1d8 = CONCAT44(uStack_1d4,iVar20);
              local_10c = iVar50 * iVar23 + iVar31 * 0x80;
              uVar42 = uVar8 * iVar20 + local_10c;
              if (uVar42 != 0) {
                uVar22 = (int)uVar42 >> 0x1f;
                iVar28 = (((int)(((uVar42 ^ uVar22) - uVar22) + 0x40) >> 7 ^ uVar22) - uVar22) * 4;
              }
              if (0x1fffe < iVar49) {
                iVar49 = 0x1ffff;
              }
              if (iVar49 < -0x1ffff) {
                iVar49 = -0x20000;
              }
              if (0x1fffe < iVar28) {
                iVar28 = 0x1ffff;
              }
              if (iVar28 < -0x1ffff) {
                iVar28 = -0x20000;
              }
              *piVar47 = iVar49;
              piVar47[1] = iVar28;
              iVar28 = 0;
              iVar49 = 0;
              uVar42 = uVar45 * (iVar23 + iVar13) + iVar43 * 0x80 + iVar35 * iVar20;
              if (uVar42 != 0) {
                uVar22 = (int)uVar42 >> 0x1f;
                iVar49 = (((int)(((uVar42 ^ uVar22) - uVar22) + 0x40) >> 7 ^ uVar22) - uVar22) * 4;
              }
              uVar42 = iVar50 * (iVar23 + iVar13) + iVar31 * 0x80 + uVar8 * iVar20;
              if (uVar42 != 0) {
                uVar22 = (int)uVar42 >> 0x1f;
                iVar28 = (((int)(((uVar42 ^ uVar22) - uVar22) + 0x40) >> 7 ^ uVar22) - uVar22) * 4;
              }
              if (0x1fffe < iVar49) {
                iVar49 = 0x1ffff;
              }
              if (iVar49 < -0x1ffff) {
                iVar49 = -0x20000;
              }
              piVar47[2] = iVar49;
              if (0x1fffe < iVar28) {
                iVar28 = 0x1ffff;
              }
              if (iVar28 < -0x1ffff) {
                iVar28 = -0x20000;
              }
              piVar47[3] = iVar28;
              if (bVar52 && (bVar10 || bVar7)) {
                iVar31 = 0;
                iVar49 = 0;
                uVar42 = iVar35 * (iVar20 + iVar51) + iVar12;
                if (uVar42 != 0) {
                  uVar22 = (int)uVar42 >> 0x1f;
                  iVar49 = (((int)(((uVar42 ^ uVar22) - uVar22) + 0x40) >> 7 ^ uVar22) - uVar22) * 4
                  ;
                }
                uVar42 = uVar8 * (iVar20 + iVar51) + local_10c;
                if (uVar42 != 0) {
                  uVar22 = (int)uVar42 >> 0x1f;
                  iVar31 = (((int)(((uVar42 ^ uVar22) - uVar22) + 0x40) >> 7 ^ uVar22) - uVar22) * 4
                  ;
                }
                if (0x1fffe < iVar49) {
                  iVar49 = 0x1ffff;
                }
                if (iVar49 < -0x1ffff) {
                  iVar49 = -0x20000;
                }
                piVar47[4] = iVar49;
                if (0x1fffe < iVar31) {
                  iVar31 = 0x1ffff;
                }
                if (iVar31 < -0x1ffff) {
                  iVar31 = -0x20000;
                }
                piVar47[5] = iVar31;
              }
              uVar36 = uVar36 & 0xffffffff;
              uVar24 = local_c8;
              unaff_R12 = local_188;
              iVar49 = local_110;
            }
            lVar14 = 1;
            piVar47 = (int *)local_58;
            pcVar15 = local_20e;
            uVar6 = uVar36 & 1;
            uVar36 = 0;
          } while (uVar6 != 0);
        }
        iVar31 = iVar11 + 1;
        local_20c = iVar11;
      }
      iVar11 = iVar31;
    } while ((uVar24 < 4) && (uVar24 = uVar24 + 1, iVar11 < local_118));
  }
  uVar46 = (uint)unaff_R12;
  local_208 = core;
  if (mrg_idx < iVar11) goto LAB_00109db6;
  local_1b8[0] = 0xffffffff;
  local_1b8[1] = 0xffffffff;
  local_1b8[2] = 0xffffffff;
  local_1b8[3] = 0xffffffff;
  local_1b8[4] = 0xffffffff;
  local_1b8[5] = -1;
  local_1b8[6] = -1;
  asStack_19c[0] = -1;
  asStack_19c[1] = -1;
  _local_1f8 = (undefined1  [16])0x0;
  iVar13 = 5;
  if (local_12c < 5) {
    iVar13 = local_12c;
  }
  local_1c0 = CONCAT44(local_1c0._4_4_,iVar13);
  local_148[0] = local_124;
  local_148[1] = uVar30;
  local_148[2] = local_128;
  lVar14 = 0;
  do {
    uVar30 = local_148[lVar14];
    if (((byte)local_150[(int)uVar30] & 4) != 0) {
      local_1b8[0] = (int)local_158[(int)uVar30][0];
      local_178[0] = paasVar4[(int)uVar30][0];
      local_1b8[4] = (int)local_158[(int)uVar30][1];
      local_178[4] = paasVar4[(int)uVar30][1];
      stack0xfffffffffffffe0c = SUB1612((undefined1  [16])0x0,4);
      local_1f8._0_4_ = 1;
      break;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  iVar13 = local_120;
  bVar52 = true;
  do {
    bVar10 = bVar52;
    if (((byte)local_150[iVar13] & 4) != 0) {
      local_1b8[1] = (int)local_158[iVar13][0];
      local_178[1] = paasVar4[iVar13][0];
      local_1b8[5] = (int)local_158[iVar13][1];
      local_178[5] = paasVar4[iVar13][1];
      stack0xfffffffffffffe0c = 1;
      break;
    }
    iVar13 = local_11c;
    bVar52 = false;
  } while (bVar10);
  if (((byte)local_150[local_17c] & 4) != 0) {
    local_1b8[2] = (int)local_158[local_17c][0];
    local_178[2] = paasVar4[local_17c][0];
    local_1b8[6] = (int)local_158[local_17c][1];
    local_160 = paasVar4[local_17c][1];
    uStack_1f0 = 1;
  }
  uVar30 = (int)(local_17c + uVar21) % iVar49 & 0xfffffffc;
  uVar21 = (int)(local_17c + uVar21) / iVar49 & 0xfffffffc;
  iVar13 = uVar21 + 2;
  iVar51 = (int)(uVar21 + local_e0->pic_height_in_scu) >> 1;
  if (iVar13 < local_e0->pic_height_in_scu) {
    iVar51 = iVar13;
  }
  iVar13 = uVar30 + 2;
  iVar31 = (int)(uVar30 + local_e0->pic_width_in_scu) >> 1;
  if (iVar13 < local_e0->pic_width_in_scu) {
    iVar31 = iVar13;
  }
  uVar21 = iVar49 * iVar51 + iVar31;
  piVar47 = (int *)(ulong)uVar21;
  local_20c = iVar11;
  if (core->pichdr->slice_type == '\x03') {
    pcVar5 = core->refp[0][1].pic;
    iVar11 = iVar51 * 4;
    if (SBORROW4(pcVar5->finished_line,iVar11) != pcVar5->finished_line + iVar51 * -4 < 0) {
      ppVar1 = &pcVar5->mutex;
      pthread_mutex_lock((pthread_mutex_t *)ppVar1);
      if (SBORROW4(pcVar5->finished_line,iVar11) != pcVar5->finished_line + iVar51 * -4 < 0) {
        do {
          pthread_cond_wait((pthread_cond_t *)&pcVar5->cond,(pthread_mutex_t *)ppVar1);
        } while (SBORROW4(pcVar5->finished_line,iVar11) != pcVar5->finished_line + iVar51 * -4 < 0);
      }
      pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
    }
    pasVar26 = &local_15c;
    lVar14 = (long)local_208->refp[0][1].map_refi[(int)uVar21][0];
    if (-1 < lVar14) {
      asVar32 = local_208->refp[0][1].map_mv[(int)uVar21][0];
      asVar48[0] = 0;
      asVar48[1] = 0;
      asVar39[0] = 0;
      asVar39[1] = 0;
      if (asVar32 != (s16  [2])0x0) {
        uVar41 = (local_208->refp[0][1].pic)->list_dist[lVar14];
        piVar47 = (int *)(ulong)uVar41;
        uVar38 = local_208->refp[0][0].dist;
        sVar29 = asVar32[0];
        if ((uVar41 != uVar38) || (asVar39 = asVar32, (short)(0x4000 % (int)(short)uVar41) != 0)) {
          asVar39[0] = 0;
          asVar39[1] = 0;
          lVar14 = (long)((int)(short)uVar38 * (int)(short)(0x2000 / (int)(short)uVar41) * 2);
          if (sVar29 != 0) {
            uVar24 = lVar14 * sVar29;
            uVar36 = (long)uVar24 >> 0x3f;
            lVar16 = ((long)(((uVar24 ^ uVar36) - uVar36) + 0x2000) >> 0xe ^ uVar36) - uVar36;
            if (0x7ffe < lVar16) {
              lVar16 = 0x7fff;
            }
            uVar38 = 0x8000;
            if (-0x8000 < lVar16) {
              uVar38 = (ushort)lVar16;
            }
            asVar39[1] = 0;
            asVar39[0] = uVar38;
          }
          if (0xffff < (uint)asVar32) {
            uVar24 = lVar14 * asVar32[1];
            uVar36 = (long)uVar24 >> 0x3f;
            lVar14 = ((long)(((uVar24 ^ uVar36) - uVar36) + 0x2000) >> 0xe ^ uVar36) - uVar36;
            if (0x7ffe < lVar14) {
              lVar14 = 0x7fff;
            }
            iVar11 = -0x8000;
            if (-0x8000 < lVar14) {
              iVar11 = (int)lVar14;
            }
            asVar39 = (s16  [2])((uint)asVar39 | iVar11 << 0x10);
          }
        }
        uVar38 = local_208->refp[0][1].dist;
        if ((uVar41 != uVar38) || (asVar48 = asVar32, (short)(0x4000 % (int)(short)uVar41) != 0)) {
          asVar48[0] = 0;
          asVar48[1] = 0;
          lVar14 = (long)((int)(short)uVar38 * (int)(short)(0x2000 / (int)(short)uVar41) * 2);
          if (sVar29 != 0) {
            uVar36 = sVar29 * lVar14;
            piVar47 = (int *)((long)uVar36 >> 0x3f);
            lVar16 = ((long)(((uVar36 ^ (ulong)piVar47) - (long)piVar47) + 0x2000) >> 0xe ^
                     (ulong)piVar47) - (long)piVar47;
            if (0x7ffe < lVar16) {
              lVar16 = 0x7fff;
            }
            uVar41 = 0x8000;
            if (-0x8000 < lVar16) {
              uVar41 = (ushort)lVar16;
            }
            asVar48[1] = 0;
            asVar48[0] = uVar41;
          }
          if (0xffff < (uint)asVar32) {
            uVar24 = lVar14 * asVar32[1];
            uVar36 = (long)uVar24 >> 0x3f;
            lVar14 = ((long)(((uVar24 ^ uVar36) - uVar36) + 0x2000) >> 0xe ^ uVar36) - uVar36;
            if (0x7ffe < lVar14) {
              lVar14 = 0x7fff;
            }
            iVar11 = -0x8000;
            if (-0x8000 < lVar14) {
              iVar11 = (int)lVar14;
            }
            asVar48 = (s16  [2])((uint)asVar48 | iVar11 << 0x10);
          }
        }
      }
      local_1b8[3] = 0;
      local_178[3][0] = asVar39[0];
      local_178[3][1] = asVar39[1];
      asStack_19c[0] = 0;
      asStack_19c[1] = 0;
      goto LAB_00109983;
    }
LAB_00109949:
    uStack_1ec = 0;
  }
  else {
    pcVar5 = core->refp[0][0].pic;
    iVar51 = iVar51 * 4;
    if (pcVar5->finished_line < iVar51) {
      ppVar1 = &pcVar5->mutex;
      pthread_mutex_lock((pthread_mutex_t *)ppVar1);
      if (pcVar5->finished_line < iVar51) {
        do {
          pthread_cond_wait((pthread_cond_t *)&pcVar5->cond,(pthread_mutex_t *)ppVar1);
        } while (pcVar5->finished_line < iVar51);
      }
      pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
    }
    lVar14 = (long)local_208->refp[0][0].map_refi[(int)uVar21][0];
    if (lVar14 < 0) goto LAB_00109949;
    asVar48 = local_208->refp[0][0].map_mv[(int)uVar21][0];
    if (asVar48 == (s16  [2])0x0) {
      asVar32[0] = 0;
      asVar32[1] = 0;
    }
    else {
      sVar29 = local_208->refp[0][0].dist;
      sVar27 = (local_208->refp[0][0].pic)->list_dist[lVar14];
      if ((sVar27 != sVar29) || (asVar32 = asVar48, (short)(0x4000 % (int)sVar29) != 0)) {
        asVar32[0] = 0;
        asVar32[1] = 0;
        lVar14 = (long)((int)sVar29 * (int)(short)(0x2000 / (int)sVar27) * 2);
        if (asVar48[0] != 0) {
          uVar24 = asVar48[0] * lVar14;
          uVar36 = (long)uVar24 >> 0x3f;
          lVar16 = ((long)(((uVar24 ^ uVar36) - uVar36) + 0x2000) >> 0xe ^ uVar36) - uVar36;
          if (0x7ffe < lVar16) {
            lVar16 = 0x7fff;
          }
          uVar41 = 0x8000;
          if (-0x8000 < lVar16) {
            uVar41 = (ushort)lVar16;
          }
          asVar32[1] = 0;
          asVar32[0] = uVar41;
        }
        if (0xffff < (uint)asVar48) {
          uVar24 = asVar48[1] * lVar14;
          uVar36 = (long)uVar24 >> 0x3f;
          lVar14 = ((long)(((uVar24 ^ uVar36) - uVar36) + 0x2000) >> 0xe ^ uVar36) - uVar36;
          if (0x7ffe < lVar14) {
            lVar14 = 0x7fff;
          }
          iVar11 = -0x8000;
          if (-0x8000 < lVar14) {
            iVar11 = (int)lVar14;
          }
          asVar32 = (s16  [2])((uint)asVar32 | iVar11 << 0x10);
        }
      }
    }
    pasVar26 = (s16 (*) [2])(local_1b8 + 7);
    local_1b8[3] = 0;
    local_178[3][0] = asVar32[0];
    local_178[3][1] = asVar32[1];
    asVar48[0] = -1;
    asVar48[1] = -1;
LAB_00109983:
    local_1b8[3] = 0;
    *pasVar26 = asVar48;
    uStack_1ec = 1;
  }
  iVar11 = local_20c;
  if (local_20c < (int)local_1c0) {
    puVar25 = &DAT_00163970;
    piVar37 = (int *)0x0;
    do {
      local_20c = iVar11;
      piVar44 = &DAT_00163970 + (long)piVar37 * 4;
      uVar36 = (ulong)(uint)(&get_affine_merge_candidate_cp_num)[(long)piVar37];
      local_1fc = 0;
      local_1cc = 0;
      iVar11 = local_20c;
      if (uVar36 == 3) {
        iVar49 = *piVar44;
        if (((*(int *)(local_1f8 + (long)iVar49 * 4) != 0) &&
            (iVar13 = (&DAT_00163974)[(long)piVar37 * 4],
            *(int *)(local_1f8 + (long)iVar13 * 4) != 0)) &&
           (iVar51 = (&DAT_00163978)[(long)piVar37 * 4], *(int *)(local_1f8 + (long)iVar51 * 4) != 0
           )) {
          local_190 = piVar44;
          local_1e0 = piVar37;
          lVar14 = 0;
          piVar47 = &local_1fc;
          bVar52 = true;
          do {
            bVar10 = bVar52;
            uVar46 = local_1b8[lVar14 * 4 + (long)iVar49];
            if (((-1 < (int)uVar46) && (-1 < (int)local_1b8[lVar14 * 4 + (long)iVar13])) &&
               ((uVar46 == local_1b8[lVar14 * 4 + (long)iVar51] &&
                ((uVar46 == local_1b8[lVar14 * 4 + (long)iVar13] &&
                 (-1 < (int)local_1b8[lVar14 * 4 + (long)iVar51])))))) {
              *piVar47 = 1;
            }
            lVar14 = 1;
            piVar47 = &local_1cc;
            bVar52 = false;
          } while (bVar10);
          goto LAB_00109b02;
        }
        uVar36 = unaff_R12 & 0xffffffff;
      }
      else {
        local_190 = piVar44;
        local_1e0 = piVar37;
        if ((&get_affine_merge_candidate_cp_num)[(long)piVar37] == 2) {
          iVar49 = *piVar44;
          if ((*(int *)(local_1f8 + (long)iVar49 * 4) != 0) &&
             (iVar13 = (&DAT_00163974)[(long)piVar37 * 4],
             *(int *)(local_1f8 + (long)iVar13 * 4) != 0)) {
            lVar14 = 0;
            piVar37 = &local_1fc;
            bVar52 = true;
            do {
              bVar10 = bVar52;
              uVar46 = local_1b8[lVar14 * 4 + (long)iVar49];
              piVar47 = (int *)(ulong)uVar46;
              if ((-1 < (int)uVar46) && (uVar46 == local_1b8[lVar14 * 4 + (long)iVar13])) {
                *piVar37 = 1;
              }
              lVar14 = 1;
              piVar37 = &local_1cc;
              bVar52 = false;
            } while (bVar10);
            goto LAB_00109b02;
          }
        }
        else {
LAB_00109b02:
          if (local_1cc != 0 || local_1fc != 0) {
            if (local_20c == (int)local_1c8) {
              piVar47 = (int *)CONCAT71((int7)((ulong)piVar47 >> 8),1);
              local_188 = (ulong)((int)local_1e0 - 1);
              piVar33 = local_b8;
              piVar37 = &local_1fc;
              pcVar15 = local_20e + 1;
              lVar14 = 0;
              do {
                if (*piVar37 == 0) {
                  *pcVar15 = -1;
                }
                else {
                  _local_1d8 = CONCAT44(uStack_1d4,(int)piVar47);
                  uVar24 = 0;
                  do {
                    lVar16 = (long)(int)puVar25[uVar24];
                    local_b8[lVar14 * 8 + lVar16 * 2] = (int)local_178[lVar14 * 4 + lVar16][0];
                    local_b8[lVar14 * 8 + lVar16 * 2 + 1] = (int)local_178[lVar14 * 4 + lVar16][1];
                    uVar24 = uVar24 + 1;
                  } while (uVar36 != uVar24);
                  switch(local_188) {
                  case 0:
                    *(ulong *)(piVar33 + 4) =
                         CONCAT44(((int)((ulong)*(undefined8 *)piVar33 >> 0x20) +
                                  (int)((ulong)*(undefined8 *)(piVar33 + 6) >> 0x20)) -
                                  (int)((ulong)*(undefined8 *)(piVar33 + 2) >> 0x20),
                                  ((int)*(undefined8 *)piVar33 + (int)*(undefined8 *)(piVar33 + 6))
                                  - (int)*(undefined8 *)(piVar33 + 2));
                    break;
                  case 1:
                    *(ulong *)(piVar33 + 2) =
                         CONCAT44(((int)((ulong)*(undefined8 *)piVar33 >> 0x20) +
                                  (int)((ulong)*(undefined8 *)(piVar33 + 6) >> 0x20)) -
                                  (int)((ulong)*(undefined8 *)(piVar33 + 4) >> 0x20),
                                  ((int)*(undefined8 *)piVar33 + (int)*(undefined8 *)(piVar33 + 6))
                                  - (int)*(undefined8 *)(piVar33 + 4));
                    break;
                  case 2:
                    *(ulong *)piVar33 =
                         CONCAT44(((int)((ulong)*(undefined8 *)(piVar33 + 4) >> 0x20) +
                                  (int)((ulong)*(undefined8 *)(piVar33 + 2) >> 0x20)) -
                                  (int)((ulong)*(undefined8 *)(piVar33 + 6) >> 0x20),
                                  ((int)*(undefined8 *)(piVar33 + 4) +
                                  (int)*(undefined8 *)(piVar33 + 2)) -
                                  (int)*(undefined8 *)(piVar33 + 6));
                    break;
                  case 4:
                    bVar17 = (g_tbl_log2[local_100] - g_tbl_log2[local_108]) + 7;
                    iVar11 = 0;
                    iVar49 = 0;
                    uVar46 = *piVar33 * 0x80 + (piVar33[5] - piVar33[1] << (bVar17 & 0x1f));
                    if (uVar46 != 0) {
                      uVar21 = (int)uVar46 >> 0x1f;
                      iVar49 = ((int)(((uVar46 ^ uVar21) - uVar21) + 0x40) >> 7 ^ uVar21) - uVar21;
                    }
                    piVar33[2] = iVar49;
                    uVar46 = (*piVar33 - piVar33[4] << (bVar17 & 0x1f)) + piVar33[1] * 0x80;
                    if (uVar46 != 0) {
                      uVar21 = (int)uVar46 >> 0x1f;
                      iVar11 = ((int)(((uVar46 ^ uVar21) - uVar21) + 0x40) >> 7 ^ uVar21) - uVar21;
                    }
                    piVar33[3] = iVar11;
                  }
                  *pcVar15 = (char)local_1b8[lVar14 * 4 + (long)*piVar44];
                  uVar24 = 0;
                  piVar47 = (int *)((ulong)piVar47 & 0xffffffff);
                  do {
                    iVar11 = local_b8[lVar14 * 8 + uVar24 * 2 + 1];
                    iVar49 = local_b8[lVar14 * 8 + uVar24 * 2] << 2;
                    local_b8[lVar14 * 8 + uVar24 * 2] = iVar49;
                    iVar11 = iVar11 << 2;
                    if (0x1fffe < iVar49) {
                      iVar49 = 0x1ffff;
                    }
                    if (iVar49 < -0x1ffff) {
                      iVar49 = -0x20000;
                    }
                    local_b8[lVar14 * 8 + uVar24 * 2 + 1] = iVar11;
                    if (0x1fffe < iVar11) {
                      iVar11 = 0x1ffff;
                    }
                    if (iVar11 < -0x1ffff) {
                      iVar11 = -0x20000;
                    }
                    *(int *)(local_78 + uVar24 * 8 + lVar14 * 0x20) = iVar49;
                    *(int *)(local_78 + uVar24 * 8 + lVar14 * 0x20 + 4) = iVar11;
                    uVar24 = uVar24 + 1;
                  } while (uVar36 != uVar24);
                }
                piVar37 = &local_1cc;
                lVar14 = 1;
                piVar33 = local_98;
                pcVar15 = local_20e;
                uVar24 = (ulong)piVar47 & 1;
                piVar47 = (int *)0x0;
              } while (uVar24 != 0);
            }
            piVar37 = local_1e0;
            iVar11 = local_20c + 1;
            local_190 = piVar44;
            goto LAB_00109d8a;
          }
        }
        uVar36 = unaff_R12 & 0xffffffff;
        piVar37 = local_1e0;
        local_190 = piVar44;
      }
LAB_00109d8a:
      uVar46 = (uint)uVar36;
      if ((int *)0x4 < piVar37) break;
      piVar37 = (int *)((long)piVar37 + 1);
      puVar25 = puVar25 + 4;
      unaff_R12 = uVar36;
    } while (iVar11 < (int)local_1c0);
  }
LAB_00109db6:
  pcVar9 = local_208;
  if (iVar11 <= (int)local_1c8) {
    local_20e[1] = 0;
    local_20e[0] = -1;
    local_78 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_48 = (undefined1  [16])0x0;
    uVar46 = 2;
  }
  local_208->affine_flag = (char)uVar46 + 0xff;
  lVar14 = 0;
  pcVar15 = local_20e + 1;
  pcVar34 = local_208;
  bVar52 = true;
  do {
    bVar10 = bVar52;
    if (*pcVar15 < '\0') {
      pcVar34->refi[lVar14] = -1;
    }
    else {
      pcVar34->refi[lVar14] = *pcVar15;
      if (0 < (int)uVar46) {
        memcpy(pcVar9->affine_mv + lVar14,local_78 + lVar14 * 0x20,(ulong)uVar46 << 3);
        pcVar34 = local_208;
      }
    }
    lVar14 = 1;
    pcVar15 = local_20e;
    bVar52 = false;
  } while (bVar10);
  return;
}

Assistant:

void dec_derive_skip_mv_affine(com_core_t * core, int mrg_idx)
{
    s8  mrg_list_refi  [REFP_NUM];
    int mrg_list_cp_num;
    CPMV mrg_list_cp_mv[REFP_NUM][VER_NUM][MV_D];
    int cp_idx, lidx;

    get_affine_merge_candidate(core, mrg_list_refi, mrg_list_cp_mv, &mrg_list_cp_num, mrg_idx);
    
    core->affine_flag = mrg_list_cp_num - 1;

    for (lidx = 0; lidx < REFP_NUM; lidx++) {
        if (REFI_IS_VALID(mrg_list_refi[lidx])) {
            core->refi[lidx] = mrg_list_refi[lidx];
            for (cp_idx = 0; cp_idx < mrg_list_cp_num; cp_idx++) {
                CP64(core->affine_mv[lidx][cp_idx], mrg_list_cp_mv[lidx][cp_idx]);
            }
        } else {
            core->refi[lidx] = REFI_INVALID;
        }
    }
}